

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

int ucnv_compareNames_63(char *name1,char *name2)

{
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  uint8_t local_39;
  byte local_32;
  uint8_t local_31;
  byte local_2b;
  byte local_28;
  byte local_27;
  UBool afterDigit2;
  UBool afterDigit1;
  char c2;
  char c1;
  uint8_t nextType;
  uint8_t type;
  int rc;
  char *name2_local;
  char *name1_local;
  
  bVar1 = false;
  bVar2 = false;
  name2_local = name1;
  _c2 = (byte *)name2;
LAB_00432136:
  do {
    pbVar3 = (byte *)(name2_local + 1);
    local_27 = *name2_local;
    name2_local = (char *)pbVar3;
    if (local_27 != 0) {
      if ((char)local_27 < '\0') {
        local_2b = 0;
      }
      else {
        local_2b = ""[local_27];
      }
      if (local_2b == 0) {
        bVar1 = false;
        goto LAB_00432136;
      }
      if (local_2b == 1) {
        if (!bVar1) {
          if ((char)*pbVar3 < '\0') {
            local_31 = '\0';
          }
          else {
            local_31 = ""[*pbVar3];
          }
          if ((local_31 == '\x01') || (local_31 == '\x02')) goto LAB_00432136;
        }
      }
      else if (local_2b == 2) {
        bVar1 = true;
      }
      else {
        local_27 = local_2b;
        bVar1 = false;
      }
    }
    while( true ) {
      pbVar3 = _c2 + 1;
      local_28 = *_c2;
      _c2 = pbVar3;
      if (local_28 == 0) break;
      if ((char)local_28 < '\0') {
        local_32 = 0;
      }
      else {
        local_32 = ""[local_28];
      }
      if (local_32 == 0) {
        bVar2 = false;
      }
      else {
        if (local_32 != 1) {
          if (local_32 == 2) {
            bVar2 = true;
          }
          else {
            local_28 = local_32;
            bVar2 = false;
          }
          break;
        }
        if (bVar2) break;
        if ((char)*pbVar3 < '\0') {
          local_39 = '\0';
        }
        else {
          local_39 = ""[*pbVar3];
        }
        if ((local_39 != '\x01') && (local_39 != '\x02')) break;
      }
    }
    if (local_27 == 0 && local_28 == 0) {
      return 0;
    }
    if ((uint)local_27 - (uint)local_28 != 0) {
      return (uint)local_27 - (uint)local_28;
    }
  } while( true );
}

Assistant:

U_CAPI int U_EXPORT2
ucnv_compareNames(const char *name1, const char *name2) {
    int rc;
    uint8_t type, nextType;
    char c1, c2;
    UBool afterDigit1 = FALSE, afterDigit2 = FALSE;

    for (;;) {
        while ((c1 = *name1++) != 0) {
            type = GET_CHAR_TYPE(c1);
            switch (type) {
            case UIGNORE:
                afterDigit1 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit1) {
                    nextType = GET_CHAR_TYPE(*name1);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit1 = TRUE;
                break;
            default:
                c1 = (char)type; /* lowercased letter */
                afterDigit1 = FALSE;
                break;
            }
            break; /* deliver c1 */
        }
        while ((c2 = *name2++) != 0) {
            type = GET_CHAR_TYPE(c2);
            switch (type) {
            case UIGNORE:
                afterDigit2 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit2) {
                    nextType = GET_CHAR_TYPE(*name2);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit2 = TRUE;
                break;
            default:
                c2 = (char)type; /* lowercased letter */
                afterDigit2 = FALSE;
                break;
            }
            break; /* deliver c2 */
        }

        /* If we reach the ends of both strings then they match */
        if ((c1|c2)==0) {
            return 0;
        }

        /* Case-insensitive comparison */
        rc = (int)(unsigned char)c1 - (int)(unsigned char)c2;
        if (rc != 0) {
            return rc;
        }
    }
}